

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

void rasterizeTriangle(Vec3f *points,Vec3f *norms,Vec2f *text,
                      vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                      vector<float,_std::allocator<float>_> *zBuffer)

{
  float *pfVar1;
  Vec3f local_e4;
  Vec3<float> local_d8;
  Vec3<float> local_cc;
  int local_c0;
  int local_bc;
  int y;
  int x;
  Vec3<float> local_ac;
  int local_a0;
  int local_9c;
  int maxY;
  int minY;
  int maxX;
  int minX;
  Vec3f barycenter;
  Vec3f PA;
  Vec3f AC;
  Vec3f AB;
  Vec3f P;
  Vec3f C;
  Vec3f B;
  Vec3f A;
  vector<float,_std::allocator<float>_> *zBuffer_local;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer_local;
  Vec2f *text_local;
  Vec3f *norms_local;
  Vec3f *points_local;
  
  Vec3<float>::Vec3((Vec3<float> *)&B.y);
  Vec3<float>::Vec3((Vec3<float> *)&C.y);
  Vec3<float>::Vec3((Vec3<float> *)&P.y);
  Vec3<float>::Vec3((Vec3<float> *)&AB.y);
  Vec3<float>::Vec3((Vec3<float> *)&AC.y);
  Vec3<float>::Vec3((Vec3<float> *)&PA.y);
  Vec3<float>::Vec3((Vec3<float> *)&barycenter.y);
  Vec3<float>::Vec3((Vec3<float> *)&maxX);
  Vec3<float>::operator=((Vec3<float> *)&B.y,points);
  Vec3<float>::operator=((Vec3<float> *)&C.y,points + 1);
  Vec3<float>::operator=((Vec3<float> *)&P.y,points + 2);
  Vec3<float>::Vec3(&local_ac,C.y - B.y,C.z - B.z,B.x - A.x);
  Vec3<float>::operator=((Vec3<float> *)&AC.y,&local_ac);
  Vec3<float>::Vec3((Vec3<float> *)&y,P.y - B.y,P.z - B.z,C.x - A.x);
  Vec3<float>::operator=((Vec3<float> *)&PA.y,(Vec3<float> *)&y);
  pfVar1 = std::min<float>(&C.y,&P.y);
  pfVar1 = std::min<float>(&B.y,pfVar1);
  minY = (int)*pfVar1;
  pfVar1 = std::max<float>(&C.y,&P.y);
  pfVar1 = std::max<float>(&B.y,pfVar1);
  maxY = (int)*pfVar1;
  pfVar1 = std::min<float>(&C.z,&P.z);
  pfVar1 = std::min<float>(&B.z,pfVar1);
  local_9c = (int)*pfVar1;
  pfVar1 = std::max<float>(&C.z,&P.z);
  pfVar1 = std::max<float>(&B.z,pfVar1);
  local_a0 = (int)*pfVar1;
  for (local_bc = minY; local_bc <= maxY; local_bc = local_bc + 1) {
    for (local_c0 = local_9c; local_c0 <= local_a0; local_c0 = local_c0 + 1) {
      Vec3<float>::Vec3(&local_cc,(float)local_bc,(float)local_c0,1.0);
      Vec3<float>::operator=((Vec3<float> *)&AB.y,&local_cc);
      Vec3<float>::Vec3(&local_d8,B.y - AB.y,B.z - AB.z,A.x - P.x);
      Vec3<float>::operator=((Vec3<float> *)&barycenter.y,&local_d8);
      getBarycentricCoordinates(&local_e4,(Vec3f *)&AC.y,(Vec3f *)&PA.y);
      Vec3<float>::operator=((Vec3<float> *)&maxX,&local_e4);
      if (((0.0 < (float)maxX) && (0.0 < (float)minX)) && (0.0 < barycenter.x)) {
        updateZBuffer(local_bc,local_c0,points,text,norms,(Vec3f *)&maxX,framebuffer,zBuffer);
      }
    }
  }
  return;
}

Assistant:

void rasterizeTriangle(Vec3f points[], const Vec3f norms[], Vec2f text[], std::vector<Vec3f> &framebuffer,
                       std::vector<float> &zBuffer) {
    Vec3f A, B, C, P, AB, AC, PA, barycenter;
    int minX, maxX, minY, maxY;

    A = points[0];
    B = points[1];
    C = points[2];

    AB = Vec3f(
        B.x - A.x,
        B.y - A.y,
        B.z - A.z
    );

    AC = Vec3f(
            C.x - A.x,
            C.y - A.y,
            C.z - A.z
    );

    // finding bounding box
    minX = std::min(A.x, std::min(B.x, C.x));
    maxX = std::max(A.x, std::max(B.x, C.x));
    minY = std::min(A.y, std::min(B.y, C.y));
    maxY = std::max(A.y, std::max(B.y, C.y));

    // iterating on bounding box
    for(int x = minX; x <= maxX; x++){
        for(int y = minY; y <= maxY; y++){
            P = Vec3f(x, y, 1);
            PA = Vec3f(
                    A.x - P.x,
                    A.y - P.y,
                    A.z - P.z
            );
            barycenter = getBarycentricCoordinates(AB, AC, PA);
            // checking if inside triangle and update z-buffer
            if(barycenter.x > 0 && barycenter.y > 0 && barycenter.z > 0){
                updateZBuffer(x, y, points, text, norms, barycenter, framebuffer, zBuffer);
            }
        }
    }
}